

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_tessellator.cc
# Opt level: O2

void __thiscall
S2EdgeTessellator::AppendUnprojected
          (S2EdgeTessellator *this,R2Point *pa,R2Point *pb,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  pointer pVVar1;
  bool bVar2;
  ostream *poVar3;
  S2Point a;
  S2Point b;
  S2LogMessage local_30;
  
  (*this->proj_->_vptr_Projection[3])(&a,this->proj_,pa);
  (*this->proj_->_vptr_Projection[3])(&b,this->proj_,pb);
  pVVar1 = (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
      super__Vector_impl_data._M_start == pVVar1) {
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back(vertices,&a);
  }
  else {
    bVar2 = S2::ApproxEquals(pVVar1 + -1,&a,(S1Angle)0x3cd203af9ee75616);
    if (!bVar2) {
      S2LogMessage::S2LogMessage
                (&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_tessellator.cc"
                 ,0xff,kFatal,(ostream *)&std::cerr);
      poVar3 = std::operator<<(local_30.stream_,
                               "Check failed: S2::ApproxEquals(vertices->back(), a) ");
      std::operator<<(poVar3,"Appended edges must form a chain");
      abort();
    }
  }
  AppendUnprojected(this,pa,&a,pb,&b,vertices);
  return;
}

Assistant:

void S2EdgeTessellator::AppendUnprojected(
    const R2Point& pa, const R2Point& pb, vector<S2Point>* vertices) const {
  S2Point a = proj_.Unproject(pa);
  S2Point b = proj_.Unproject(pb);
  if (vertices->empty()) {
    vertices->push_back(a);
  } else {
    // Note that coordinate wrapping can create a small amount of error.  For
    // example in the edge chain "0:-175, 0:179, 0:-177", the first edge is
    // transformed into "0:-175, 0:-181" while the second is transformed into
    // "0:179, 0:183".  The two coordinate pairs for the middle vertex
    // ("0:-181" and "0:179") may not yield exactly the same S2Point.
    S2_DCHECK(S2::ApproxEquals(vertices->back(), a))
        << "Appended edges must form a chain";
  }
  AppendUnprojected(pa, a, pb, b, vertices);
}